

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reference.hpp
# Opt level: O0

void __thiscall
type_safe::function_ref<void(int)>::function_ref<void,int>
          (function_ref<void(int)> *this,undefined8 param_2)

{
  undefined8 *puVar1;
  char *local_38;
  undefined4 local_30;
  undefined8 *local_28;
  undefined8 local_20;
  _func_void_int *fptr_local;
  function_ref<void_(int)> *this_local;
  
  local_28 = &local_20;
  local_38 = 
  "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/reference.hpp"
  ;
  local_30 = 0x2ba;
  local_20 = param_2;
  fptr_local = (_func_void_int *)this;
  debug_assert::detail::
  do_assert<type_safe::function_ref<void(int)>::function_ref<void,int>(type_safe::detail::matching_function_pointer_tag,void(*)(int))::_lambda()_1_,type_safe::detail::precondition_error_handler,char_const(&)[34]>
            (&local_28,&local_38,"fptr","function pointer must not be null");
  puVar1 = (undefined8 *)
           detail::aligned_union<void_*,_void_(*)(int)>::get
                     ((aligned_union<void_*,_void_(*)(int)> *)this);
  *puVar1 = local_20;
  *(code **)(this + 8) = invoke_function_pointer<void(*)(int),void(*)()>;
  return;
}

Assistant:

function_ref(detail::matching_function_pointer_tag, Return2 (*fptr)(Args2...))
    {
        using pointer_type        = Return2 (*)(Args2...);
        using stored_pointer_type = void (*)();

        DEBUG_ASSERT(fptr, detail::precondition_error_handler{},
                     "function pointer must not be null");
        ::new (storage_.get()) stored_pointer_type(reinterpret_cast<stored_pointer_type>(fptr));

        cb_ = &invoke_function_pointer<pointer_type, stored_pointer_type>;
    }